

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# koi8_u.h
# Opt level: O0

int koi8_u_wctomb(void *conv,uchar *r,uint wc,int n)

{
  uchar local_29;
  uchar c;
  int n_local;
  uint wc_local;
  uchar *r_local;
  void *conv_local;
  
  local_29 = '\0';
  if (wc < 0x80) {
    *r = (uchar)wc;
    conv_local._4_4_ = 1;
  }
  else {
    if ((wc < 0xa0) || (0xf7 < wc)) {
      if ((wc < 0x400) || (0x497 < wc)) {
        if ((wc < 0x2218) || (0x2267 < wc)) {
          if ((wc < 0x2320) || (8999 < wc)) {
            if ((0x24ff < wc) && (wc < 0x25a8)) {
              local_29 = koi8_u_page25[wc - 0x2500];
            }
          }
          else {
            local_29 = koi8_u_page23[wc - 0x2320];
          }
        }
        else {
          local_29 = ""[wc - 0x2218];
        }
      }
      else {
        local_29 = ""[wc - 0x400];
      }
    }
    else {
      local_29 = koi8_u_page00[wc - 0xa0];
    }
    if (local_29 == '\0') {
      conv_local._4_4_ = -1;
    }
    else {
      *r = local_29;
      conv_local._4_4_ = 1;
    }
  }
  return conv_local._4_4_;
}

Assistant:

static int
koi8_u_wctomb (conv_t conv, unsigned char *r, ucs4_t wc, int n)
{
  unsigned char c = 0;
  if (wc < 0x0080) {
    *r = wc;
    return 1;
  }
  else if (wc >= 0x00a0 && wc < 0x00f8)
    c = koi8_u_page00[wc-0x00a0];
  else if (wc >= 0x0400 && wc < 0x0498)
    c = koi8_u_page04[wc-0x0400];
  else if (wc >= 0x2218 && wc < 0x2268)
    c = koi8_u_page22[wc-0x2218];
  else if (wc >= 0x2320 && wc < 0x2328)
    c = koi8_u_page23[wc-0x2320];
  else if (wc >= 0x2500 && wc < 0x25a8)
    c = koi8_u_page25[wc-0x2500];
  if (c != 0) {
    *r = c;
    return 1;
  }
  return RET_ILSEQ;
}